

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_index(FuncState *fs,ExpDesc *t,ExpDesc *e)

{
  anon_union_8_3_2ce71dea_for_u aVar1;
  uint uVar2;
  BCReg BVar3;
  BCReg idx;
  int32_t k;
  lua_Number n;
  ExpDesc *e_local;
  ExpDesc *t_local;
  FuncState *fs_local;
  
  t->k = VINDEXED;
  if (e->k == VKLAST) {
    aVar1 = e->u;
    uVar2 = (uint)(double)aVar1;
    if (uVar2 == (uVar2 & 0xff)) {
      if (((double)aVar1 == (double)(int)uVar2) && (!NAN((double)aVar1) && !NAN((double)(int)uVar2))
         ) {
        (t->u).s.aux = uVar2 + 0x100;
        return;
      }
    }
  }
  else if ((e->k == VKSTR) && (BVar3 = const_str(fs,e), BVar3 < 0x100)) {
    (t->u).s.aux = BVar3 ^ 0xffffffff;
    return;
  }
  BVar3 = expr_toanyreg(fs,e);
  (t->u).s.aux = BVar3;
  return;
}

Assistant:

static void expr_index(FuncState *fs, ExpDesc *t, ExpDesc *e)
{
  /* Already called: expr_toval(fs, e). */
  t->k = VINDEXED;
  if (expr_isnumk(e)) {
#if LJ_DUALNUM
    if (tvisint(expr_numtv(e))) {
      int32_t k = intV(expr_numtv(e));
      if (checku8(k)) {
	t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
	return;
      }
    }
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checku8(k) && n == (lua_Number)k) {
      t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
      return;
    }
#endif
  } else if (expr_isstrk(e)) {
    BCReg idx = const_str(fs, e);
    if (idx <= BCMAX_C) {
      t->u.s.aux = ~idx;  /* -256..-1: const string key */
      return;
    }
  }
  t->u.s.aux = expr_toanyreg(fs, e);  /* 0..255: register */
}